

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddAddVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vector,int deepest)

{
  int iVar1;
  DdNode *g;
  DdNode *h;
  DdHalfWord local_5c;
  ptrint fanout;
  DdNode *res;
  DdNode *E;
  DdNode *T;
  int deepest_local;
  DdNode **vector_local;
  DdNode *f_local;
  DdHashTable *table_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    local_5c = f->index;
  }
  else {
    local_5c = dd->perm[f->index];
  }
  dd_local = (DdManager *)f;
  if (((int)local_5c <= deepest) &&
     (dd_local = (DdManager *)cuddHashTableLookup1(table,f), dd_local == (DdManager *)0x0)) {
    g = cuddAddVectorComposeRecur(dd,table,(f->type).kids.T,vector,deepest);
    if (g == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
      h = cuddAddVectorComposeRecur(dd,table,(f->type).kids.E,vector,deepest);
      if (h == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,g);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)h & 0xfffffffffffffffe) + 4) + 1;
        dd_local = (DdManager *)cuddAddIteRecur(dd,vector[f->index],g,h);
        if (dd_local == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,g);
          Cudd_RecursiveDeref(dd,h);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,g);
          Cudd_RecursiveDeref(dd,h);
          if ((f->ref == 1) ||
             (iVar1 = cuddHashTableInsert1(table,f,(DdNode *)dd_local,(ulong)f->ref - 1), iVar1 != 0
             )) {
            *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
          }
          else {
            Cudd_RecursiveDeref(dd,(DdNode *)dd_local);
            dd_local = (DdManager *)0x0;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddAddVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* ADD in which to compose */,
  DdNode ** vector /* functions to substitute */,
  int  deepest /* depth of deepest substitution */)
{
    DdNode      *T,*E;
    DdNode      *res;

    statLine(dd);
    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,f->index) > deepest) {
        return(f);
    }

    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
#ifdef DD_DEBUG
        addVectorComposeHits++;
#endif
        return(res);
    }

    /* Split and recur on children of this node. */
    T = cuddAddVectorComposeRecur(dd,table,cuddT(f),vector,deepest);
    if (T == NULL)  return(NULL);
    cuddRef(T);
    E = cuddAddVectorComposeRecur(dd,table,cuddE(f),vector,deepest);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Retrieve the 0-1 ADD for the current top variable and call
    ** cuddAddIteRecur with the T and E we just created.
    */
    res = cuddAddIteRecur(dd,vector[f->index],T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, T);
    Cudd_RecursiveDeref(dd, E);

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again
    */
    if (f->ref != 1) {
        ptrint fanout = (ptrint) f->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(res);

}